

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_encode.c
# Opt level: O0

cram_block * cram_encode_slice_header(cram_fd *fd,cram_slice *s)

{
  cram_block_slice_hdr *pcVar1;
  undefined8 uVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int j;
  cram_block *b;
  char *cp;
  char *buf;
  cram_slice *s_local;
  cram_fd *fd_local;
  
  fd_local = (cram_fd *)cram_new_block(MAPPED_SLICE,0);
  if (fd_local == (cram_fd *)0x0) {
    fd_local = (cram_fd *)0x0;
  }
  else {
    pbVar4 = (byte *)malloc((long)((s->hdr->num_blocks + 8) * 5 + 0x10));
    if (pbVar4 == (byte *)0x0) {
      cram_free_block((cram_block *)fd_local);
      fd_local = (cram_fd *)0x0;
    }
    else {
      if ((s->hdr->ref_seq_id & 0xffffff80U) == 0) {
        *pbVar4 = (byte)s->hdr->ref_seq_id;
        local_40 = 1;
      }
      else {
        if ((s->hdr->ref_seq_id & 0xffffc000U) == 0) {
          *pbVar4 = (byte)((uint)s->hdr->ref_seq_id >> 8) | 0x80;
          pbVar4[1] = (byte)s->hdr->ref_seq_id;
          local_44 = 2;
        }
        else {
          if ((s->hdr->ref_seq_id & 0xffe00000U) == 0) {
            *pbVar4 = (byte)((uint)s->hdr->ref_seq_id >> 0x10) | 0xc0;
            pbVar4[1] = (byte)((uint)s->hdr->ref_seq_id >> 8);
            pbVar4[2] = (byte)s->hdr->ref_seq_id;
            local_48 = 3;
          }
          else {
            if ((s->hdr->ref_seq_id & 0xf0000000U) == 0) {
              *pbVar4 = (byte)((uint)s->hdr->ref_seq_id >> 0x18) | 0xe0;
              pbVar4[1] = (byte)((uint)s->hdr->ref_seq_id >> 0x10);
              pbVar4[2] = (byte)((uint)s->hdr->ref_seq_id >> 8);
              pbVar4[3] = (byte)s->hdr->ref_seq_id;
              local_4c = 4;
            }
            else {
              *pbVar4 = (byte)(s->hdr->ref_seq_id >> 0x1c) | 0xf0;
              pbVar4[1] = (byte)(s->hdr->ref_seq_id >> 0x14);
              pbVar4[2] = (byte)(s->hdr->ref_seq_id >> 0xc);
              pbVar4[3] = (byte)(s->hdr->ref_seq_id >> 4);
              pbVar4[4] = (byte)s->hdr->ref_seq_id & 0xf;
              local_4c = 5;
            }
            local_48 = local_4c;
          }
          local_44 = local_48;
        }
        local_40 = local_44;
      }
      pbVar5 = pbVar4 + local_40;
      if ((s->hdr->ref_seq_start & 0xffffff80U) == 0) {
        *pbVar5 = (byte)s->hdr->ref_seq_start;
        local_50 = 1;
      }
      else {
        if ((s->hdr->ref_seq_start & 0xffffc000U) == 0) {
          *pbVar5 = (byte)((uint)s->hdr->ref_seq_start >> 8) | 0x80;
          pbVar5[1] = (byte)s->hdr->ref_seq_start;
          local_54 = 2;
        }
        else {
          if ((s->hdr->ref_seq_start & 0xffe00000U) == 0) {
            *pbVar5 = (byte)((uint)s->hdr->ref_seq_start >> 0x10) | 0xc0;
            pbVar5[1] = (byte)((uint)s->hdr->ref_seq_start >> 8);
            pbVar5[2] = (byte)s->hdr->ref_seq_start;
            local_58 = 3;
          }
          else {
            if ((s->hdr->ref_seq_start & 0xf0000000U) == 0) {
              *pbVar5 = (byte)((uint)s->hdr->ref_seq_start >> 0x18) | 0xe0;
              pbVar5[1] = (byte)((uint)s->hdr->ref_seq_start >> 0x10);
              pbVar5[2] = (byte)((uint)s->hdr->ref_seq_start >> 8);
              pbVar5[3] = (byte)s->hdr->ref_seq_start;
              local_5c = 4;
            }
            else {
              *pbVar5 = (byte)(s->hdr->ref_seq_start >> 0x1c) | 0xf0;
              pbVar5[1] = (byte)(s->hdr->ref_seq_start >> 0x14);
              pbVar5[2] = (byte)(s->hdr->ref_seq_start >> 0xc);
              pbVar5[3] = (byte)(s->hdr->ref_seq_start >> 4);
              pbVar5[4] = (byte)s->hdr->ref_seq_start & 0xf;
              local_5c = 5;
            }
            local_58 = local_5c;
          }
          local_54 = local_58;
        }
        local_50 = local_54;
      }
      pbVar5 = pbVar5 + local_50;
      if ((s->hdr->ref_seq_span & 0xffffff80U) == 0) {
        *pbVar5 = (byte)s->hdr->ref_seq_span;
        local_60 = 1;
      }
      else {
        if ((s->hdr->ref_seq_span & 0xffffc000U) == 0) {
          *pbVar5 = (byte)((uint)s->hdr->ref_seq_span >> 8) | 0x80;
          pbVar5[1] = (byte)s->hdr->ref_seq_span;
          local_64 = 2;
        }
        else {
          if ((s->hdr->ref_seq_span & 0xffe00000U) == 0) {
            *pbVar5 = (byte)((uint)s->hdr->ref_seq_span >> 0x10) | 0xc0;
            pbVar5[1] = (byte)((uint)s->hdr->ref_seq_span >> 8);
            pbVar5[2] = (byte)s->hdr->ref_seq_span;
            local_68 = 3;
          }
          else {
            if ((s->hdr->ref_seq_span & 0xf0000000U) == 0) {
              *pbVar5 = (byte)((uint)s->hdr->ref_seq_span >> 0x18) | 0xe0;
              pbVar5[1] = (byte)((uint)s->hdr->ref_seq_span >> 0x10);
              pbVar5[2] = (byte)((uint)s->hdr->ref_seq_span >> 8);
              pbVar5[3] = (byte)s->hdr->ref_seq_span;
              local_6c = 4;
            }
            else {
              *pbVar5 = (byte)(s->hdr->ref_seq_span >> 0x1c) | 0xf0;
              pbVar5[1] = (byte)(s->hdr->ref_seq_span >> 0x14);
              pbVar5[2] = (byte)(s->hdr->ref_seq_span >> 0xc);
              pbVar5[3] = (byte)(s->hdr->ref_seq_span >> 4);
              pbVar5[4] = (byte)s->hdr->ref_seq_span & 0xf;
              local_6c = 5;
            }
            local_68 = local_6c;
          }
          local_64 = local_68;
        }
        local_60 = local_64;
      }
      pbVar5 = pbVar5 + local_60;
      if ((s->hdr->num_records & 0xffffff80U) == 0) {
        *pbVar5 = (byte)s->hdr->num_records;
        local_70 = 1;
      }
      else {
        if ((s->hdr->num_records & 0xffffc000U) == 0) {
          *pbVar5 = (byte)((uint)s->hdr->num_records >> 8) | 0x80;
          pbVar5[1] = (byte)s->hdr->num_records;
          local_74 = 2;
        }
        else {
          if ((s->hdr->num_records & 0xffe00000U) == 0) {
            *pbVar5 = (byte)((uint)s->hdr->num_records >> 0x10) | 0xc0;
            pbVar5[1] = (byte)((uint)s->hdr->num_records >> 8);
            pbVar5[2] = (byte)s->hdr->num_records;
            local_78 = 3;
          }
          else {
            if ((s->hdr->num_records & 0xf0000000U) == 0) {
              *pbVar5 = (byte)((uint)s->hdr->num_records >> 0x18) | 0xe0;
              pbVar5[1] = (byte)((uint)s->hdr->num_records >> 0x10);
              pbVar5[2] = (byte)((uint)s->hdr->num_records >> 8);
              pbVar5[3] = (byte)s->hdr->num_records;
              local_7c = 4;
            }
            else {
              *pbVar5 = (byte)(s->hdr->num_records >> 0x1c) | 0xf0;
              pbVar5[1] = (byte)(s->hdr->num_records >> 0x14);
              pbVar5[2] = (byte)(s->hdr->num_records >> 0xc);
              pbVar5[3] = (byte)(s->hdr->num_records >> 4);
              pbVar5[4] = (byte)s->hdr->num_records & 0xf;
              local_7c = 5;
            }
            local_78 = local_7c;
          }
          local_74 = local_78;
        }
        local_70 = local_74;
      }
      b = (cram_block *)(pbVar5 + local_70);
      if (fd->version >> 8 == 2) {
        if ((s->hdr->record_counter & 0xffffffffffffff80U) == 0) {
          *(char *)&b->method = (char)s->hdr->record_counter;
          local_80 = 1;
        }
        else {
          if ((s->hdr->record_counter & 0xffffffffffffc000U) == 0) {
            *(undefined1 *)&b->method = (char)((ulong)s->hdr->record_counter >> 8) | 0x80;
            *(byte *)((long)&b->method + 1) = (byte)s->hdr->record_counter;
            local_84 = 2;
          }
          else {
            if ((s->hdr->record_counter & 0xffffffffffe00000U) == 0) {
              *(undefined1 *)&b->method = (char)((ulong)s->hdr->record_counter >> 0x10) | 0xc0;
              *(byte *)((long)&b->method + 1) = (byte)((ulong)s->hdr->record_counter >> 8);
              *(byte *)((long)&b->method + 2) = (byte)s->hdr->record_counter;
              local_88 = 3;
            }
            else {
              if ((s->hdr->record_counter & 0xfffffffff0000000U) == 0) {
                *(undefined1 *)&b->method = (char)((ulong)s->hdr->record_counter >> 0x18) | 0xe0;
                *(byte *)((long)&b->method + 1) = (byte)((ulong)s->hdr->record_counter >> 0x10);
                *(byte *)((long)&b->method + 2) = (byte)((ulong)s->hdr->record_counter >> 8);
                *(byte *)((long)&b->method + 3) = (byte)s->hdr->record_counter;
                local_8c = 4;
              }
              else {
                *(undefined1 *)&b->method = (char)(s->hdr->record_counter >> 0x1c) | 0xf0;
                *(byte *)((long)&b->method + 1) = (byte)(s->hdr->record_counter >> 0x14);
                *(byte *)((long)&b->method + 2) = (byte)(s->hdr->record_counter >> 0xc);
                *(byte *)((long)&b->method + 3) = (byte)(s->hdr->record_counter >> 4);
                *(undefined1 *)&b->orig_method = (char)s->hdr->record_counter & 0xf;
                local_8c = 5;
              }
              local_88 = local_8c;
            }
            local_84 = local_88;
          }
          local_80 = local_84;
        }
        b = (cram_block *)((long)&b->method + (long)local_80);
      }
      else if (2 < fd->version >> 8) {
        iVar3 = ltf8_put((char *)b,s->hdr->record_counter);
        b = (cram_block *)((long)&b->method + (long)iVar3);
      }
      if ((s->hdr->num_blocks & 0xffffff80U) == 0) {
        *(char *)&b->method = (char)s->hdr->num_blocks;
        local_90 = 1;
      }
      else {
        if ((s->hdr->num_blocks & 0xffffc000U) == 0) {
          *(undefined1 *)&b->method = (char)((uint)s->hdr->num_blocks >> 8) | 0x80;
          *(byte *)((long)&b->method + 1) = (byte)s->hdr->num_blocks;
          local_94 = 2;
        }
        else {
          if ((s->hdr->num_blocks & 0xffe00000U) == 0) {
            *(undefined1 *)&b->method = (char)((uint)s->hdr->num_blocks >> 0x10) | 0xc0;
            *(byte *)((long)&b->method + 1) = (byte)((uint)s->hdr->num_blocks >> 8);
            *(byte *)((long)&b->method + 2) = (byte)s->hdr->num_blocks;
            local_98 = 3;
          }
          else {
            if ((s->hdr->num_blocks & 0xf0000000U) == 0) {
              *(undefined1 *)&b->method = (char)((uint)s->hdr->num_blocks >> 0x18) | 0xe0;
              *(byte *)((long)&b->method + 1) = (byte)((uint)s->hdr->num_blocks >> 0x10);
              *(byte *)((long)&b->method + 2) = (byte)((uint)s->hdr->num_blocks >> 8);
              *(byte *)((long)&b->method + 3) = (byte)s->hdr->num_blocks;
              local_9c = 4;
            }
            else {
              *(undefined1 *)&b->method = (char)(s->hdr->num_blocks >> 0x1c) | 0xf0;
              *(byte *)((long)&b->method + 1) = (byte)(s->hdr->num_blocks >> 0x14);
              *(byte *)((long)&b->method + 2) = (byte)(s->hdr->num_blocks >> 0xc);
              *(byte *)((long)&b->method + 3) = (byte)(s->hdr->num_blocks >> 4);
              *(undefined1 *)&b->orig_method = (char)s->hdr->num_blocks & 0xf;
              local_9c = 5;
            }
            local_98 = local_9c;
          }
          local_94 = local_98;
        }
        local_90 = local_94;
      }
      pbVar5 = (byte *)((long)&b->method + (long)local_90);
      if ((s->hdr->num_content_ids & 0xffffff80U) == 0) {
        *pbVar5 = (byte)s->hdr->num_content_ids;
        local_a0 = 1;
      }
      else {
        if ((s->hdr->num_content_ids & 0xffffc000U) == 0) {
          *pbVar5 = (byte)((uint)s->hdr->num_content_ids >> 8) | 0x80;
          pbVar5[1] = (byte)s->hdr->num_content_ids;
          local_a4 = 2;
        }
        else {
          if ((s->hdr->num_content_ids & 0xffe00000U) == 0) {
            *pbVar5 = (byte)((uint)s->hdr->num_content_ids >> 0x10) | 0xc0;
            pbVar5[1] = (byte)((uint)s->hdr->num_content_ids >> 8);
            pbVar5[2] = (byte)s->hdr->num_content_ids;
            local_a8 = 3;
          }
          else {
            if ((s->hdr->num_content_ids & 0xf0000000U) == 0) {
              *pbVar5 = (byte)((uint)s->hdr->num_content_ids >> 0x18) | 0xe0;
              pbVar5[1] = (byte)((uint)s->hdr->num_content_ids >> 0x10);
              pbVar5[2] = (byte)((uint)s->hdr->num_content_ids >> 8);
              pbVar5[3] = (byte)s->hdr->num_content_ids;
              local_ac = 4;
            }
            else {
              *pbVar5 = (byte)(s->hdr->num_content_ids >> 0x1c) | 0xf0;
              pbVar5[1] = (byte)(s->hdr->num_content_ids >> 0x14);
              pbVar5[2] = (byte)(s->hdr->num_content_ids >> 0xc);
              pbVar5[3] = (byte)(s->hdr->num_content_ids >> 4);
              pbVar5[4] = (byte)s->hdr->num_content_ids & 0xf;
              local_ac = 5;
            }
            local_a8 = local_ac;
          }
          local_a4 = local_a8;
        }
        local_a0 = local_a4;
      }
      b = (cram_block *)(pbVar5 + local_a0);
      for (local_3c = 0; local_3c < s->hdr->num_content_ids; local_3c = local_3c + 1) {
        if ((s->hdr->block_content_ids[local_3c] & 0xffffff80U) == 0) {
          *(char *)&b->method = (char)s->hdr->block_content_ids[local_3c];
          local_b0 = 1;
        }
        else {
          if ((s->hdr->block_content_ids[local_3c] & 0xffffc000U) == 0) {
            *(undefined1 *)&b->method =
                 (char)((uint)s->hdr->block_content_ids[local_3c] >> 8) | 0x80;
            *(byte *)((long)&b->method + 1) = (byte)s->hdr->block_content_ids[local_3c];
            local_b4 = 2;
          }
          else {
            if ((s->hdr->block_content_ids[local_3c] & 0xffe00000U) == 0) {
              *(undefined1 *)&b->method =
                   (char)((uint)s->hdr->block_content_ids[local_3c] >> 0x10) | 0xc0;
              *(byte *)((long)&b->method + 1) =
                   (byte)((uint)s->hdr->block_content_ids[local_3c] >> 8);
              *(byte *)((long)&b->method + 2) = (byte)s->hdr->block_content_ids[local_3c];
              local_b8 = 3;
            }
            else {
              if ((s->hdr->block_content_ids[local_3c] & 0xf0000000U) == 0) {
                *(undefined1 *)&b->method =
                     (char)((uint)s->hdr->block_content_ids[local_3c] >> 0x18) | 0xe0;
                *(byte *)((long)&b->method + 1) =
                     (byte)((uint)s->hdr->block_content_ids[local_3c] >> 0x10);
                *(byte *)((long)&b->method + 2) =
                     (byte)((uint)s->hdr->block_content_ids[local_3c] >> 8);
                *(byte *)((long)&b->method + 3) = (byte)s->hdr->block_content_ids[local_3c];
                local_bc = 4;
              }
              else {
                *(undefined1 *)&b->method =
                     (char)(s->hdr->block_content_ids[local_3c] >> 0x1c) | 0xf0;
                *(byte *)((long)&b->method + 1) =
                     (byte)(s->hdr->block_content_ids[local_3c] >> 0x14);
                *(byte *)((long)&b->method + 2) = (byte)(s->hdr->block_content_ids[local_3c] >> 0xc)
                ;
                *(byte *)((long)&b->method + 3) = (byte)(s->hdr->block_content_ids[local_3c] >> 4);
                *(undefined1 *)&b->orig_method = (char)s->hdr->block_content_ids[local_3c] & 0xf;
                local_bc = 5;
              }
              local_b8 = local_bc;
            }
            local_b4 = local_b8;
          }
          local_b0 = local_b4;
        }
        b = (cram_block *)((long)&b->method + (long)local_b0);
      }
      if (s->hdr->content_type == MAPPED_SLICE) {
        if ((s->hdr->ref_base_id & 0xffffff80U) == 0) {
          *(char *)&b->method = (char)s->hdr->ref_base_id;
          local_c0 = 1;
        }
        else {
          if ((s->hdr->ref_base_id & 0xffffc000U) == 0) {
            *(undefined1 *)&b->method = (char)((uint)s->hdr->ref_base_id >> 8) | 0x80;
            *(byte *)((long)&b->method + 1) = (byte)s->hdr->ref_base_id;
            local_c4 = 2;
          }
          else {
            if ((s->hdr->ref_base_id & 0xffe00000U) == 0) {
              *(undefined1 *)&b->method = (char)((uint)s->hdr->ref_base_id >> 0x10) | 0xc0;
              *(byte *)((long)&b->method + 1) = (byte)((uint)s->hdr->ref_base_id >> 8);
              *(byte *)((long)&b->method + 2) = (byte)s->hdr->ref_base_id;
              local_c8 = 3;
            }
            else {
              if ((s->hdr->ref_base_id & 0xf0000000U) == 0) {
                *(undefined1 *)&b->method = (char)((uint)s->hdr->ref_base_id >> 0x18) | 0xe0;
                *(byte *)((long)&b->method + 1) = (byte)((uint)s->hdr->ref_base_id >> 0x10);
                *(byte *)((long)&b->method + 2) = (byte)((uint)s->hdr->ref_base_id >> 8);
                *(byte *)((long)&b->method + 3) = (byte)s->hdr->ref_base_id;
                local_cc = 4;
              }
              else {
                *(undefined1 *)&b->method = (char)(s->hdr->ref_base_id >> 0x1c) | 0xf0;
                *(byte *)((long)&b->method + 1) = (byte)(s->hdr->ref_base_id >> 0x14);
                *(byte *)((long)&b->method + 2) = (byte)(s->hdr->ref_base_id >> 0xc);
                *(byte *)((long)&b->method + 3) = (byte)(s->hdr->ref_base_id >> 4);
                *(undefined1 *)&b->orig_method = (char)s->hdr->ref_base_id & 0xf;
                local_cc = 5;
              }
              local_c8 = local_cc;
            }
            local_c4 = local_c8;
          }
          local_c0 = local_c4;
        }
        b = (cram_block *)((long)&b->method + (long)local_c0);
      }
      if (fd->version >> 8 != 1) {
        pcVar1 = s->hdr;
        uVar2 = *(undefined8 *)pcVar1->md5;
        b->method = (int)uVar2;
        b->orig_method = (int)((ulong)uVar2 >> 0x20);
        uVar2 = *(undefined8 *)(pcVar1->md5 + 8);
        b->content_type = (int)uVar2;
        b->content_id = (int)((ulong)uVar2 >> 0x20);
        b = (cram_block *)&b->comp_size;
      }
      if ((long)((s->hdr->num_blocks + 8) * 5 + 0x10) < (long)b - (long)pbVar4) {
        __assert_fail("cp-buf <= 16+5*(8+s->hdr->num_blocks)",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_encode.c"
                      ,0x2c1,"cram_block *cram_encode_slice_header(cram_fd *, cram_slice *)");
      }
      fd_local->prefix = (char *)pbVar4;
      iVar3 = (int)b - (int)pbVar4;
      *(int *)((long)&fd_local->file_def + 4) = iVar3;
      *(int *)&fd_local->file_def = iVar3;
    }
  }
  return (cram_block *)fd_local;
}

Assistant:

cram_block *cram_encode_slice_header(cram_fd *fd, cram_slice *s) {
    char *buf;
    char *cp;
    cram_block *b = cram_new_block(MAPPED_SLICE, 0);
    int j;

    if (!b)
	return NULL;

    if (NULL == (cp = buf = malloc(16+5*(8+s->hdr->num_blocks)))) {
	cram_free_block(b);
	return NULL;
    }

    cp += itf8_put(cp, s->hdr->ref_seq_id);
    cp += itf8_put(cp, s->hdr->ref_seq_start);
    cp += itf8_put(cp, s->hdr->ref_seq_span);
    cp += itf8_put(cp, s->hdr->num_records);
    if (CRAM_MAJOR_VERS(fd->version) == 2)
	cp += itf8_put(cp, s->hdr->record_counter);
    else if (CRAM_MAJOR_VERS(fd->version) >= 3)
	cp += ltf8_put(cp, s->hdr->record_counter);
    cp += itf8_put(cp, s->hdr->num_blocks);
    cp += itf8_put(cp, s->hdr->num_content_ids);
    for (j = 0; j < s->hdr->num_content_ids; j++) {
	cp += itf8_put(cp, s->hdr->block_content_ids[j]);
    }
    if (s->hdr->content_type == MAPPED_SLICE)
	cp += itf8_put(cp, s->hdr->ref_base_id);

    if (CRAM_MAJOR_VERS(fd->version) != 1) {
	memcpy(cp, s->hdr->md5, 16); cp += 16;
    }
    
    assert(cp-buf <= 16+5*(8+s->hdr->num_blocks));

    b->data = (unsigned char *)buf;
    b->comp_size = b->uncomp_size = cp-buf;

    return b;
}